

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void seto_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if (((((pMyDisasm->Reserved_).EVEX.state == '\x01') ||
       ((pMyDisasm->Reserved_).VEX.state != '\x01')) || ((pMyDisasm->Reserved_).VEX.L != '\0')) ||
     (((int)(uint)(pMyDisasm->Reserved_).VEX.vvvv >> 3 & 1U) != 1)) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Instruction).Category = 0x10005;
      strcpy((pMyDisasm->Instruction).Mnemonic,"seto");
      (pMyDisasm->Reserved_).MemDecoration = 1;
      (pMyDisasm->Reserved_).OperandSize = 8;
      decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      FillFlags(pMyDisasm,0x5f);
    }
  }
  else if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      (pMyDisasm->Instruction).Category = 0x140000;
      strcpy((pMyDisasm->Instruction).Mnemonic,"kmovb");
      (pMyDisasm->Reserved_).MemDecoration = 0x65;
      (pMyDisasm->Reserved_).Register_ = 0x400;
      GxEx(pMyDisasm);
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      (pMyDisasm->Instruction).Category = 0x140000;
      strcpy((pMyDisasm->Instruction).Mnemonic,"kmovw");
      (pMyDisasm->Reserved_).MemDecoration = 0x66;
      (pMyDisasm->Reserved_).Register_ = 0x400;
      GxEx(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
    (pMyDisasm->Instruction).Category = 0x140000;
    strcpy((pMyDisasm->Instruction).Mnemonic,"kmovd");
    (pMyDisasm->Reserved_).MemDecoration = 0x67;
    (pMyDisasm->Reserved_).Register_ = 0x400;
    GxEx(pMyDisasm);
  }
  else if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
    (pMyDisasm->Instruction).Category = 0x140000;
    strcpy((pMyDisasm->Instruction).Mnemonic,"kmovq");
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    (pMyDisasm->Reserved_).Register_ = 0x400;
    GxEx(pMyDisasm);
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ seto_(PDISASM pMyDisasm)
{
  if (
      (GV.EVEX.state != InUsePrefix) &&
      (GV.VEX.state == InUsePrefix) &&
      (GV.VEX.L == 0) &&
      (((GV.VEX.vvvv >> 3) & 0x1) == 1)
    ) {
    if (GV.REX.W_ == 0) {
      if (GV.VEX.pp == 1) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovb");
        #endif
        GV.MemDecoration = Arg2byte;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else if (GV.VEX.pp == 0) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovw");
        #endif
        GV.MemDecoration = Arg2word;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      if (GV.VEX.pp == 1) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovd");
        #endif
        GV.MemDecoration = Arg2dword;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else if (GV.VEX.pp == 0) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kmovq");
        #endif
        GV.MemDecoration = Arg2qword;
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
  }
  else if (GV.VEX.state != InUsePrefix){
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "seto");
    #endif
    GV.MemDecoration = Arg1byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
    GV.OperandSize = 32;
    GV.EIP_+= GV.DECALAGE_EIP+2;
    FillFlags(pMyDisasm,95);
  }
  else {
    failDecode(pMyDisasm);
  }
}